

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.cpp
# Opt level: O3

void crnlib::LzmaDec_WriteRem(CLzmaDec *p,SizeT limit)

{
  UInt32 UVar1;
  uint uVar2;
  Byte *pBVar3;
  SizeT SVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  UInt32 UVar9;
  ulong uVar10;
  SizeT SVar11;
  
  uVar7 = p->remainLen;
  if (uVar7 - 1 < 0x111) {
    uVar10 = p->dicPos;
    uVar8 = limit - uVar10 & 0xffffffff;
    if ((ulong)uVar7 <= limit - uVar10) {
      uVar8 = (ulong)uVar7;
    }
    uVar6 = (uint)uVar8;
    if (p->checkDicSize == 0) {
      UVar1 = (p->prop).dicSize;
      UVar9 = p->processedPos;
      if (UVar1 - UVar9 <= uVar6) {
        p->checkDicSize = UVar1;
      }
    }
    else {
      UVar9 = p->processedPos;
    }
    uVar2 = p->reps[0];
    pBVar3 = p->dic;
    SVar4 = p->dicBufSize;
    p->processedPos = UVar9 + uVar6;
    p->remainLen = uVar7 - uVar6;
    if (uVar6 != 0) {
      uVar5 = uVar10;
      do {
        SVar11 = 0;
        if (uVar5 < uVar2) {
          SVar11 = SVar4;
        }
        uVar10 = uVar5 + 1;
        pBVar3[uVar5] = pBVar3[uVar5 + (SVar11 - uVar2)];
        uVar7 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar7;
        uVar5 = uVar10;
      } while (uVar7 != 0);
    }
    p->dicPos = uVar10;
  }
  return;
}

Assistant:

static void MY_FAST_CALL LzmaDec_WriteRem(CLzmaDec* p, SizeT limit) {
  if (p->remainLen != 0 && p->remainLen < kMatchSpecLenStart) {
    Byte* dic = p->dic;
    SizeT dicPos = p->dicPos;
    SizeT dicBufSize = p->dicBufSize;
    unsigned len = p->remainLen;
    UInt32 rep0 = p->reps[0];
    if (limit - dicPos < len)
      len = (unsigned)(limit - dicPos);

    if (p->checkDicSize == 0 && p->prop.dicSize - p->processedPos <= len)
      p->checkDicSize = p->prop.dicSize;

    p->processedPos += len;
    p->remainLen -= len;
    while (len-- != 0) {
      dic[dicPos] = dic[(dicPos - rep0) + ((dicPos < rep0) ? dicBufSize : 0)];
      dicPos++;
    }
    p->dicPos = dicPos;
  }
}